

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::csharp::ToCSharpName
                   (string *__return_storage_ptr__,string *name,FileDescriptor *file)

{
  string local_d0 [32];
  string local_b0 [32];
  undefined1 local_90 [8];
  string result;
  string classname;
  allocator local_2a;
  allocator local_29;
  
  GetFileNamespace_abi_cxx11_((string *)local_90,(csharp *)file,file);
  if (result._M_dataplus._M_p != (pointer)0x0) {
    std::__cxx11::string::push_back((char)local_90);
  }
  result.field_2._8_8_ = &classname._M_string_length;
  classname._M_dataplus._M_p = (pointer)0x0;
  classname._M_string_length._0_1_ = 0;
  if (*(long *)(*(long *)(file + 8) + 8) == 0) {
    std::__cxx11::string::_M_assign((string *)(result.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&classname.field_2 + 8),(ulong)name);
    std::__cxx11::string::operator=
              ((string *)(result.field_2._M_local_buf + 8),
               (string *)(classname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(classname.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string(local_d0,".",&local_2a);
  std::__cxx11::string::string(local_b0,".Types.",&local_29);
  google::protobuf::StringReplace
            ((string *)(classname.field_2._M_local_buf + 8),
             (string *)(result.field_2._M_local_buf + 8),local_d0,SUB81(local_b0,0));
  std::__cxx11::string::append((string *)local_90);
  std::__cxx11::string::~string((string *)(classname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::operator+(__return_storage_ptr__,"global::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCSharpName(const std::string& name, const FileDescriptor* file) {
  std::string result = GetFileNamespace(file);
  if (!result.empty()) {
    result += '.';
  }
  string classname;
  if (file->package().empty()) {
    classname = name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the C# namespace.
    classname = name.substr(file->package().size() + 1);
  }
  result += StringReplace(classname, ".", ".Types.", true);
  return "global::" + result;
}